

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar3;
  LogMessage *pLVar4;
  Type *local_120;
  MessageLite *result;
  LogMessage local_110;
  LogFinisher local_d2;
  byte local_d1;
  LogMessage local_d0;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  Extension *local_48;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  MessageLite *prototype_local;
  FieldType type_local;
  ExtensionSet *pEStack_28;
  int number_local;
  ExtensionSet *this_local;
  ExtensionSet *local_18;
  ExtensionSet *local_10;
  
  extension = (Extension *)descriptor;
  descriptor_local = (FieldDescriptor *)prototype;
  prototype_local._3_1_ = type;
  prototype_local._4_4_ = number;
  pEStack_28 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_48);
  if (bVar1) {
    local_48->type = prototype_local._3_1_;
    CVar2 = anon_unknown_22::cpp_type(local_48->type);
    local_81 = 0;
    if (CVar2 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x337);
      local_81 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_80,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(local_95,pLVar4);
    }
    if ((local_81 & 1) != 0) {
      LogMessage::~LogMessage(&local_80);
    }
    local_48->is_repeated = true;
    this_local = (ExtensionSet *)this->arena_;
    local_18 = this_local;
    local_10 = this_local;
    pRVar3 = Arena::
             CreateMessageInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                       ((Arena *)this_local);
    (local_48->field_0).repeated_message_value = pRVar3;
  }
  else {
    local_d1 = 0;
    if ((local_48->is_repeated & 1U) == 0) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x33c);
      local_d1 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                         );
      LogFinisher::operator=(&local_d2,pLVar4);
    }
    if ((local_d1 & 1) != 0) {
      LogMessage::~LogMessage(&local_d0);
    }
    CVar2 = anon_unknown_22::cpp_type(local_48->type);
    result._7_1_ = 0;
    if (CVar2 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x33c);
      result._7_1_ = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_110,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)((long)&result + 6),pLVar4);
    }
    if ((result._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_110);
    }
  }
  local_120 = RepeatedPtrFieldBase::
              AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                        ((RepeatedPtrFieldBase *)(local_48->field_0).string_value);
  if (local_120 == (Type *)0x0) {
    local_120 = (Type *)(**(code **)(*(long *)descriptor_local + 0x18))
                                  (descriptor_local,this->arena_);
    RepeatedPtrField<google::protobuf::MessageLite>::AddAllocated
              ((local_48->field_0).repeated_message_value,local_120);
  }
  return local_120;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  // RepeatedPtrField<MessageLite> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                            extension->repeated_message_value)
                            ->AddFromCleared<GenericTypeHandler<MessageLite>>();
  if (result == nullptr) {
    result = prototype.New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}